

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O0

Box * __thiscall amrex::BATransformer::coarsen(BATransformer *this,Box *a_box)

{
  Box *in_RDX;
  undefined4 *in_RSI;
  Box *in_RDI;
  Box *in_stack_00000090;
  BATbndryReg *in_stack_00000098;
  
  switch(*in_RSI) {
  case 0:
    BATnull::coarsen(in_RDI,(BATnull *)(in_RSI + 1),in_RDX);
    break;
  case 1:
    BATindexType::coarsen(in_RDI,(BATindexType *)(in_RSI + 1),in_RDX);
    break;
  case 2:
    BATcoarsenRatio::coarsen((BATcoarsenRatio *)in_stack_00000098,in_stack_00000090);
    break;
  case 3:
    BATindexType_coarsenRatio::coarsen
              ((BATindexType_coarsenRatio *)in_stack_00000098,in_stack_00000090);
    break;
  default:
    BATbndryReg::coarsen(in_stack_00000098,in_stack_00000090);
  }
  return in_RDI;
}

Assistant:

Box coarsen (Box const& a_box) const noexcept  {
        switch (m_bat_type)
        {
        case     BATType::null:
            return m_op.m_null.coarsen(a_box);
        case     BATType::indexType:
            return m_op.m_indexType.coarsen(a_box);
        case     BATType::coarsenRatio:
            return m_op.m_coarsenRatio.coarsen(a_box);
        case     BATType::indexType_coarsenRatio:
            return m_op.m_indexType_coarsenRatio.coarsen(a_box);
        default:
            return m_op.m_bndryReg.coarsen(a_box);
        }
    }